

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::filter_changed
          (QSortFilterProxyModelPrivate *this,Directions directions,QModelIndex *source_parent)

{
  long lVar1;
  bool bVar2;
  Mapping **ppMVar3;
  qsizetype qVar4;
  const_reference this_00;
  const_iterator o;
  int *piVar5;
  QSortFilterProxyModelPrivate *in_RDX;
  QSortFilterProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *source_child_index;
  int i;
  Mapping *m;
  const_iterator removeBegin;
  const_iterator removeIt;
  QList<int> indexesToRemove;
  QList<QModelIndex> mappedChildren;
  QSet<int> columns_removed;
  QSet<int> rows_removed;
  const_iterator it;
  undefined4 in_stack_fffffffffffffed8;
  Direction in_stack_fffffffffffffedc;
  QList<QModelIndex> *in_stack_fffffffffffffee0;
  QList<QModelIndex> *this_01;
  const_iterator *in_stack_fffffffffffffee8;
  bool local_10a;
  QModelIndex *source_parent_00;
  int local_e8;
  Mapping *source_parent_01;
  QSortFilterProxyModelPrivate *source_parent_02;
  QList<int> *in_stack_ffffffffffffff40;
  QList<int> *in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  QList<QModelIndex> local_80;
  QFlagsStorageHelper<QSortFilterProxyModel::Direction,_4> local_64;
  undefined1 *local_60;
  QFlagsStorageHelper<QSortFilterProxyModel::Direction,_4> local_54;
  undefined1 *local_50;
  piter local_48;
  QModelIndexWrapper local_38;
  undefined1 *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  stack0xffffffffffffffe8 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  source_parent_00 = (QModelIndex *)&in_RDI->source_index_mapping;
  source_parent_02 = in_RDI;
  QtPrivate::QModelIndexWrapper::QModelIndexWrapper(&local_38,(QModelIndex *)in_RDX);
  _local_20 = (piter)QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
                     constFind((QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>
                                *)in_stack_fffffffffffffee0,
                               (QModelIndexWrapper *)
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_48 = (piter)QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
                    constEnd((QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>
                              *)in_stack_fffffffffffffee8);
  bVar2 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
          const_iterator::operator==
                    (in_stack_fffffffffffffee8,(const_iterator *)in_stack_fffffffffffffee0);
  if (!bVar2) {
    ppMVar3 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
              const_iterator::value((const_iterator *)0x871d82);
    source_parent_01 = *ppMVar3;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_54.super_QFlagsStorage<QSortFilterProxyModel::Direction>.i =
         (QFlagsStorage<QSortFilterProxyModel::Direction>)
         QFlags<QSortFilterProxyModel::Direction>::operator&
                   ((QFlags<QSortFilterProxyModel::Direction> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_54);
    if (bVar2) {
      handle_filter_changed
                ((QSortFilterProxyModelPrivate *)in_stack_ffffffffffffff50.i,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(QModelIndex *)source_parent_02
                 ,(Direction)((ulong)in_RDX >> 0x20));
    }
    else {
      QSet<int>::QSet((QSet<int> *)0x871dff);
    }
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_64.super_QFlagsStorage<QSortFilterProxyModel::Direction>.i =
         (QFlagsStorage<QSortFilterProxyModel::Direction>)
         QFlags<QSortFilterProxyModel::Direction>::operator&
                   ((QFlags<QSortFilterProxyModel::Direction> *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffedc);
    bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_64);
    if (bVar2) {
      handle_filter_changed
                ((QSortFilterProxyModelPrivate *)in_stack_ffffffffffffff50.i,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(QModelIndex *)source_parent_02
                 ,(Direction)((ulong)in_RDX >> 0x20));
    }
    else {
      QSet<int>::QSet((QSet<int> *)0x871e78);
    }
    local_80.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_80.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_80.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList
              (in_stack_fffffffffffffee0,
               (QList<QModelIndex> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QList<int>::QList((QList<int> *)0x871ef5);
    for (local_e8 = 0; qVar4 = QList<QModelIndex>::size(&local_80), local_e8 < qVar4;
        local_e8 = local_e8 + 1) {
      this_00 = QList<QModelIndex>::at
                          (in_stack_fffffffffffffee0,
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QModelIndex::row(this_00);
      bVar2 = QSet<int>::contains((QSet<int> *)in_stack_fffffffffffffee0,
                                  (int *)CONCAT44(in_stack_fffffffffffffedc,
                                                  in_stack_fffffffffffffed8));
      local_10a = true;
      if (!bVar2) {
        QModelIndex::column(this_00);
        local_10a = QSet<int>::contains((QSet<int> *)in_stack_fffffffffffffee0,
                                        (int *)CONCAT44(in_stack_fffffffffffffedc,
                                                        in_stack_fffffffffffffed8));
      }
      if (local_10a == false) {
        filter_changed(in_RDX,local_20._12_4_,(QModelIndex *)source_parent_01);
      }
      else {
        QList<int>::push_back((QList<int> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        remove_from_mapping(in_RDI,source_parent_00);
      }
    }
    QList<int>::constEnd((QList<int> *)in_stack_fffffffffffffee0);
    o = QList<int>::constBegin((QList<int> *)in_stack_fffffffffffffee0);
    while (bVar2 = QList<int>::const_iterator::operator!=
                             ((const_iterator *)&stack0xffffffffffffff50,o), bVar2) {
      QList<int>::const_iterator::operator--((const_iterator *)&stack0xffffffffffffff50);
      this_01 = &source_parent_01->mapped_children;
      piVar5 = QList<int>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffff50);
      QList<QModelIndex>::remove(this_01,(char *)(long)*piVar5);
    }
    QList<int>::~QList((QList<int> *)0x872135);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x872142);
    QSet<int>::~QSet((QSet<int> *)0x87214f);
    QSet<int>::~QSet((QSet<int> *)0x87215c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::filter_changed(Directions directions,
                                                  const QModelIndex &source_parent)
{
    IndexMap::const_iterator it = source_index_mapping.constFind(source_parent);
    if (it == source_index_mapping.constEnd())
        return;
    Mapping *m = it.value();
    const QSet<int> rows_removed = (directions & Direction::Rows)
                                 ? handle_filter_changed(m->proxy_rows, m->source_rows, source_parent,
                                                         Direction::Rows)
                                 : QSet<int>();
    const QSet<int> columns_removed = (directions & Direction::Columns)
                                 ? handle_filter_changed(m->proxy_columns, m->source_columns, source_parent,
                                                         Direction::Columns)
                                 : QSet<int>();

    // We need to iterate over a copy of m->mapped_children because otherwise it may be changed by other code, invalidating
    // the iterator it2.
    // The m->mapped_children vector can be appended to with indexes which are no longer filtered
    // out (in create_mapping) when this function recurses for child indexes.
    const QList<QModelIndex> mappedChildren = m->mapped_children;
    QList<int> indexesToRemove;
    for (int i = 0; i < mappedChildren.size(); ++i) {
        const QModelIndex &source_child_index = mappedChildren.at(i);
        if (rows_removed.contains(source_child_index.row()) || columns_removed.contains(source_child_index.column())) {
            indexesToRemove.push_back(i);
            remove_from_mapping(source_child_index);
        } else {
            filter_changed(directions, source_child_index);
        }
    }
    QList<int>::const_iterator removeIt = indexesToRemove.constEnd();
    const QList<int>::const_iterator removeBegin = indexesToRemove.constBegin();

    // We can't just remove these items from mappedChildren while iterating above and then
    // do something like m->mapped_children = mappedChildren, because mapped_children might
    // be appended to in create_mapping, and we would lose those new items.
    // Because they are always appended in create_mapping, we can still remove them by
    // position here.
    while (removeIt != removeBegin) {
        --removeIt;
        m->mapped_children.remove(*removeIt);
    }
}